

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_tests.cpp
# Opt level: O1

void result_tests::ExpectResult<bilingual_str>
               (Result<bilingual_str> *result,bool success,bilingual_str *str)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  undefined1 local_119;
  lazy_ostream local_118;
  undefined1 *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  bool success_local;
  bool *local_d0;
  undefined **local_c8;
  undefined1 local_c0;
  undefined1 *local_b8;
  bool **local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  assertion_result local_90;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp";
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x39;
  file.m_begin = (iterator)&local_e8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  success_local = success;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f8,msg);
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  local_119 = *(__index_type *)
               ((long)&(result->m_variant).super__Variant_base<bilingual_str,_bilingual_str>.
                       super__Move_assign_alias<bilingual_str,_bilingual_str>.
                       super__Copy_assign_alias<bilingual_str,_bilingual_str>.
                       super__Move_ctor_alias<bilingual_str,_bilingual_str>.
                       super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
                       super__Variant_storage_alias<bilingual_str,_bilingual_str> + 0x40) == '\x01';
  local_a8 = &local_119;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(success_local == (bool)local_119);
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp";
  local_98 = "";
  local_68._8_8_ = &local_a8;
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_013d4010;
  local_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_d0;
  local_c0 = 0;
  local_c8 = &PTR__lazy_ostream_013d4010;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_d0 = &success_local;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_118,1,2,REQUIRE,0xeea61f,(size_t)&local_a0,0x39,local_78,"success",
             &local_c8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp";
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x3a;
  file_00.m_begin = (iterator)&local_130;
  msg_00.m_end = pvVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_140,
             msg_00);
  local_c0 = 0;
  local_c8 = &PTR__lazy_ostream_013d3cb0;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (bool **)0xf98c4c;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp";
  local_148 = "";
  util::ErrorString<bilingual_str>((bilingual_str *)local_78,result);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bilingual_str,bilingual_str>
            (&local_c8,&local_150,0x3a,1,2,local_78,"util::ErrorString(result)",str,"str");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &local_68) {
    operator_delete((void *)local_78._0_8_,(ulong)(local_68._M_allocated_capacity + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ExpectResult(const util::Result<T>& result, bool success, const bilingual_str& str)
{
    BOOST_CHECK_EQUAL(bool(result), success);
    BOOST_CHECK_EQUAL(util::ErrorString(result), str);
}